

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O1

_Bool lz_encoder_prepare(lzma_mf *mf,lzma_allocator *allocator,lzma_lz_options_conflict *lz_options)

{
  lzma_match_finder lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  long lVar10;
  bool bVar11;
  lzma_match_finder lVar12;
  code *pcVar13;
  uint32_t uVar14;
  code *pcVar15;
  lzma_match_finder lVar16;
  
  uVar3 = lz_options->dict_size;
  bVar11 = true;
  if ((0xffffffffa0000ffe < uVar3 - 0x60000001) &&
     (uVar4 = lz_options->match_len_max, lz_options->nice_len <= uVar4)) {
    sVar5 = lz_options->before_size;
    uVar14 = (int)sVar5 + (int)uVar3;
    mf->keep_size_before = uVar14;
    lVar10 = uVar4 + lz_options->after_size;
    uVar6 = (uint32_t)lVar10;
    mf->keep_size_after = uVar6;
    uVar7 = mf->size;
    uVar6 = uVar6 + (int)(lVar10 + sVar5 >> 1) + uVar14 +
                    ((uint)(uVar3 >> 1) >> (0x40000000 < uVar3 >> 1)) + 0x80000;
    mf->size = uVar6;
    if ((mf->buffer != (uint8_t *)0x0) && (uVar7 != uVar6)) {
      lzma_free(mf->buffer,allocator);
      mf->buffer = (uint8_t *)0x0;
    }
    mf->match_len_max = (uint32_t)lz_options->match_len_max;
    lVar1 = (lzma_match_finder)lz_options->nice_len;
    mf->nice_len = lVar1;
    iVar2 = (int)lz_options->dict_size;
    uVar7 = iVar2 + 1;
    mf->cyclic_size = uVar7;
    lVar16 = lz_options->match_finder;
    if ((int)lVar16 < 0x12) {
      if (lVar16 == LZMA_MF_HC3) {
        pcVar13 = lzma_mf_hc3_skip;
        pcVar15 = lzma_mf_hc3_find;
      }
      else {
        if (lVar16 != LZMA_MF_HC4) {
          return true;
        }
        pcVar13 = lzma_mf_hc4_skip;
        pcVar15 = lzma_mf_hc4_find;
      }
    }
    else if (lVar16 == LZMA_MF_BT2) {
      pcVar13 = lzma_mf_bt2_skip;
      pcVar15 = lzma_mf_bt2_find;
    }
    else if (lVar16 == LZMA_MF_BT3) {
      pcVar13 = lzma_mf_bt3_skip;
      pcVar15 = lzma_mf_bt3_find;
    }
    else {
      if (lVar16 != LZMA_MF_BT4) {
        return true;
      }
      pcVar13 = lzma_mf_bt4_skip;
      pcVar15 = lzma_mf_bt4_find;
    }
    mf->find = pcVar15;
    mf->skip = pcVar13;
    lVar12 = lVar16 & 0xf;
    bVar11 = lVar1 < lVar12;
    if (lVar12 <= lVar1) {
      lVar16 = lVar16 & 0x10;
      uVar8 = 0xffff;
      if (((lVar12 != 2) &&
          (uVar8 = iVar2 - 1, uVar8 = uVar8 >> 1 | uVar8, uVar8 = uVar8 >> 2 | uVar8,
          uVar8 = uVar8 >> 4 | uVar8, uVar8 = uVar8 >> 1 | uVar8 >> 9 | 0xffff, 0x1000000 < uVar8))
         && (uVar8 = uVar8 >> 1, lVar12 == LZMA_MF_HC3)) {
        uVar8 = 0xffffff;
      }
      mf->hash_mask = uVar8;
      uVar9 = (uint)(LZMA_MF_HC3 < lVar12) * 0x10000 + (uint)(2 < lVar12) * 0x400 + uVar8 + 1;
      uVar6 = mf->hash_count;
      uVar7 = uVar7 << (sbyte)(lVar16 >> 4);
      uVar14 = mf->sons_count;
      mf->hash_count = uVar9;
      mf->sons_count = uVar7;
      if ((uVar6 != uVar9) || (uVar14 != uVar7)) {
        lzma_free(mf->hash,allocator);
        mf->hash = (uint32_t *)0x0;
        lzma_free(mf->son,allocator);
        mf->son = (uint32_t *)0x0;
      }
      uVar7 = lz_options->depth;
      mf->depth = uVar7;
      if (uVar7 == 0) {
        uVar8 = mf->nice_len >> (lVar16 == 0) + 1;
        uVar7 = uVar8 + 0x10;
        if (lVar16 == 0) {
          uVar7 = uVar8 + 4;
        }
        mf->depth = uVar7;
      }
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

static bool
lz_encoder_prepare(lzma_mf *mf, const lzma_allocator *allocator,
		const lzma_lz_options *lz_options)
{
	// For now, the dictionary size is limited to 1.5 GiB. This may grow
	// in the future if needed, but it needs a little more work than just
	// changing this check.
	if (lz_options->dict_size < LZMA_DICT_SIZE_MIN
			|| lz_options->dict_size
				> (UINT32_C(1) << 30) + (UINT32_C(1) << 29)
			|| lz_options->nice_len > lz_options->match_len_max)
		return true;

	mf->keep_size_before = lz_options->before_size + lz_options->dict_size;

	mf->keep_size_after = lz_options->after_size
			+ lz_options->match_len_max;

	// To avoid constant memmove()s, allocate some extra space. Since
	// memmove()s become more expensive when the size of the buffer
	// increases, we reserve more space when a large dictionary is
	// used to make the memmove() calls rarer.
	//
	// This works with dictionaries up to about 3 GiB. If bigger
	// dictionary is wanted, some extra work is needed:
	//   - Several variables in lzma_mf have to be changed from uint32_t
	//     to size_t.
	//   - Memory usage calculation needs something too, e.g. use uint64_t
	//     for mf->size.
	uint32_t reserve = lz_options->dict_size / 2;
	if (reserve > (UINT32_C(1) << 30))
		reserve /= 2;

	reserve += (lz_options->before_size + lz_options->match_len_max
			+ lz_options->after_size) / 2 + (UINT32_C(1) << 19);

	const uint32_t old_size = mf->size;
	mf->size = mf->keep_size_before + reserve + mf->keep_size_after;

	// Deallocate the old history buffer if it exists but has different
	// size than what is needed now.
	if (mf->buffer != NULL && old_size != mf->size) {
		lzma_free(mf->buffer, allocator);
		mf->buffer = NULL;
	}

	// Match finder options
	mf->match_len_max = lz_options->match_len_max;
	mf->nice_len = lz_options->nice_len;

	// cyclic_size has to stay smaller than 2 Gi. Note that this doesn't
	// mean limiting dictionary size to less than 2 GiB. With a match
	// finder that uses multibyte resolution (hashes start at e.g. every
	// fourth byte), cyclic_size would stay below 2 Gi even when
	// dictionary size is greater than 2 GiB.
	//
	// It would be possible to allow cyclic_size >= 2 Gi, but then we
	// would need to be careful to use 64-bit types in various places
	// (size_t could do since we would need bigger than 32-bit address
	// space anyway). It would also require either zeroing a multigigabyte
	// buffer at initialization (waste of time and RAM) or allow
	// normalization in lz_encoder_mf.c to access uninitialized
	// memory to keep the code simpler. The current way is simple and
	// still allows pretty big dictionaries, so I don't expect these
	// limits to change.
	mf->cyclic_size = lz_options->dict_size + 1;

	// Validate the match finder ID and setup the function pointers.
	switch (lz_options->match_finder) {
#ifdef HAVE_MF_HC3
	case LZMA_MF_HC3:
		mf->find = &lzma_mf_hc3_find;
		mf->skip = &lzma_mf_hc3_skip;
		break;
#endif
#ifdef HAVE_MF_HC4
	case LZMA_MF_HC4:
		mf->find = &lzma_mf_hc4_find;
		mf->skip = &lzma_mf_hc4_skip;
		break;
#endif
#ifdef HAVE_MF_BT2
	case LZMA_MF_BT2:
		mf->find = &lzma_mf_bt2_find;
		mf->skip = &lzma_mf_bt2_skip;
		break;
#endif
#ifdef HAVE_MF_BT3
	case LZMA_MF_BT3:
		mf->find = &lzma_mf_bt3_find;
		mf->skip = &lzma_mf_bt3_skip;
		break;
#endif
#ifdef HAVE_MF_BT4
	case LZMA_MF_BT4:
		mf->find = &lzma_mf_bt4_find;
		mf->skip = &lzma_mf_bt4_skip;
		break;
#endif

	default:
		return true;
	}

	// Calculate the sizes of mf->hash and mf->son and check that
	// nice_len is big enough for the selected match finder.
	const uint32_t hash_bytes = lz_options->match_finder & 0x0F;
	if (hash_bytes > mf->nice_len)
		return true;

	const bool is_bt = (lz_options->match_finder & 0x10) != 0;
	uint32_t hs;

	if (hash_bytes == 2) {
		hs = 0xFFFF;
	} else {
		// Round dictionary size up to the next 2^n - 1 so it can
		// be used as a hash mask.
		hs = lz_options->dict_size - 1;
		hs |= hs >> 1;
		hs |= hs >> 2;
		hs |= hs >> 4;
		hs |= hs >> 8;
		hs >>= 1;
		hs |= 0xFFFF;

		if (hs > (UINT32_C(1) << 24)) {
			if (hash_bytes == 3)
				hs = (UINT32_C(1) << 24) - 1;
			else
				hs >>= 1;
		}
	}

	mf->hash_mask = hs;

	++hs;
	if (hash_bytes > 2)
		hs += HASH_2_SIZE;
	if (hash_bytes > 3)
		hs += HASH_3_SIZE;
/*
	No match finder uses this at the moment.
	if (mf->hash_bytes > 4)
		hs += HASH_4_SIZE;
*/

	const uint32_t old_hash_count = mf->hash_count;
	const uint32_t old_sons_count = mf->sons_count;
	mf->hash_count = hs;
	mf->sons_count = mf->cyclic_size;
	if (is_bt)
		mf->sons_count *= 2;

	// Deallocate the old hash array if it exists and has different size
	// than what is needed now.
	if (old_hash_count != mf->hash_count
			|| old_sons_count != mf->sons_count) {
		lzma_free(mf->hash, allocator);
		mf->hash = NULL;

		lzma_free(mf->son, allocator);
		mf->son = NULL;
	}

	// Maximum number of match finder cycles
	mf->depth = lz_options->depth;
	if (mf->depth == 0) {
		if (is_bt)
			mf->depth = 16 + mf->nice_len / 2;
		else
			mf->depth = 4 + mf->nice_len / 4;
	}

	return false;
}